

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint32 tag,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  bool local_49;
  ExtensionInfo local_48;
  
  bVar1 = FindExtensionInfoFromFieldNumber
                    (this,tag & 7,tag >> 3,extension_finder,&local_48,&local_49);
  if (bVar1) {
    uVar2 = ParseFieldWithExtensionInfo(this,tag >> 3,local_49,&local_48,input,field_skipper);
  }
  else {
    iVar3 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,tag);
    uVar2 = (undefined1)iVar3;
  }
  return (bool)uVar2;
}

Assistant:

bool ExtensionSet::ParseField(uint32 tag, io::CodedInputStream* input,
                              ExtensionFinder* extension_finder,
                              FieldSkipper* field_skipper) {
  int number;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromTag(
      tag, extension_finder, &number, &extension, &was_packed_on_wire)) {
    return field_skipper->SkipField(input, tag);
  } else {
    return ParseFieldWithExtensionInfo(
        number, was_packed_on_wire, extension, input, field_skipper);
  }
}